

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O3

int TeleportRead(int stream,float *samples,int numsamples)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  float fVar7;
  
  if ((Teleport::GetSharedMemory()::shared == '\0') && (iVar3 = __cxa_guard_acquire(), iVar3 != 0))
  {
    Teleport::SharedMemoryHandle::SharedMemoryHandle
              ((SharedMemoryHandle *)&Teleport::GetSharedMemory()::shared);
    __cxa_atexit(Teleport::SharedMemoryHandle::~SharedMemoryHandle,
                 &Teleport::GetSharedMemory()::shared,&__dso_handle);
    __cxa_guard_release();
  }
  lVar4 = (long)stream * 0x56248 + Teleport::GetSharedMemory()::shared;
  if (numsamples < 1) {
    iVar3 = *(int *)(lVar4 + 0x20);
  }
  else {
    iVar3 = *(int *)(lVar4 + 0x20);
    iVar1 = *(int *)(lVar4 + 0x24);
    uVar5 = 0;
    iVar6 = iVar3;
    do {
      fVar7 = 0.0;
      iVar2 = iVar1;
      if (iVar6 != iVar1) {
        iVar3 = iVar6 + 1;
        if (iVar6 == 0x15887) {
          iVar3 = 0;
        }
        *(int *)(lVar4 + 0x20) = iVar3;
        fVar7 = *(float *)(lVar4 + 0x28 + (long)iVar6 * 4);
        iVar2 = iVar3;
      }
      iVar6 = iVar2;
      samples[uVar5] = fVar7;
      uVar5 = uVar5 + 1;
    } while ((uint)numsamples != uVar5);
  }
  return iVar3;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int TeleportRead(int stream, float* samples, int numsamples)
{
    Teleport::Stream& s = Teleport::GetSharedMemory()->streams[stream];
    for (int n = 0; n < numsamples; n++)
        if (!s.Read(samples[n]))
            samples[n] = 0.0f;
    return s.readpos;
}